

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::UninterpretedOption::InternalSwap
          (UninterpretedOption *this,UninterpretedOption *other)

{
  InternalMetadataWithArena *this_00;
  double dVar1;
  uint32 uVar2;
  int iVar3;
  string *psVar4;
  uint64 uVar5;
  int64 iVar6;
  void *pvVar7;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar8;
  UnknownFieldSet *pUVar9;
  UnknownFieldSet *pUVar10;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->name_).super_RepeatedPtrFieldBase,&(other->name_).super_RepeatedPtrFieldBase);
  psVar4 = (this->identifier_value_).ptr_;
  (this->identifier_value_).ptr_ = (other->identifier_value_).ptr_;
  (other->identifier_value_).ptr_ = psVar4;
  psVar4 = (this->string_value_).ptr_;
  (this->string_value_).ptr_ = (other->string_value_).ptr_;
  (other->string_value_).ptr_ = psVar4;
  psVar4 = (this->aggregate_value_).ptr_;
  (this->aggregate_value_).ptr_ = (other->aggregate_value_).ptr_;
  (other->aggregate_value_).ptr_ = psVar4;
  uVar5 = this->positive_int_value_;
  this->positive_int_value_ = other->positive_int_value_;
  other->positive_int_value_ = uVar5;
  iVar6 = this->negative_int_value_;
  this->negative_int_value_ = other->negative_int_value_;
  other->negative_int_value_ = iVar6;
  dVar1 = this->double_value_;
  this->double_value_ = other->double_value_;
  other->double_value_ = dVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar7 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar7 & 1) == 0) {
      pUVar10 = internal::
                InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                ::mutable_unknown_fields_slow
                          (&this_00->
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          );
    }
    else {
      pUVar10 = (UnknownFieldSet *)((ulong)pvVar7 & 0xfffffffffffffffe);
    }
    pvVar7 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar7 & 1) == 0) {
      pUVar9 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar7 & 0xfffffffffffffffe);
    }
    pvVar8 = pUVar9->fields_;
    pUVar9->fields_ = pUVar10->fields_;
    pUVar10->fields_ = pvVar8;
  }
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void UninterpretedOption::InternalSwap(UninterpretedOption* other) {
  name_.InternalSwap(&other->name_);
  identifier_value_.Swap(&other->identifier_value_);
  string_value_.Swap(&other->string_value_);
  aggregate_value_.Swap(&other->aggregate_value_);
  std::swap(positive_int_value_, other->positive_int_value_);
  std::swap(negative_int_value_, other->negative_int_value_);
  std::swap(double_value_, other->double_value_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}